

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_resolve_module(JSContext *ctx,JSModuleDef *m)

{
  JSAtom atom;
  JSReqModuleEntry *pJVar1;
  int iVar2;
  char *ptr;
  char *cname1;
  JSModuleDef *m_00;
  long lVar3;
  long lVar4;
  
  if ((char)*(ulong *)&m->field_0x80 != '\0') {
    return 0;
  }
  *(ulong *)&m->field_0x80 = *(ulong *)&m->field_0x80 | 1;
  if (0 < m->req_module_entries_count) {
    lVar4 = 8;
    lVar3 = 0;
    do {
      pJVar1 = m->req_module_entries;
      atom = *(JSAtom *)((long)pJVar1 + lVar4 + -8);
      ptr = JS_AtomToCString(ctx,m->module_name);
      if (ptr == (char *)0x0) {
        return -1;
      }
      cname1 = JS_AtomToCString(ctx,atom);
      if (cname1 == (char *)0x0) {
        JS_FreeCString(ctx,ptr);
        return -1;
      }
      m_00 = js_host_resolve_imported_module(ctx,ptr,cname1);
      JS_FreeCString(ctx,ptr);
      JS_FreeCString(ctx,cname1);
      if (m_00 == (JSModuleDef *)0x0) {
        return -1;
      }
      *(JSModuleDef **)((long)&pJVar1->module_name + lVar4) = m_00;
      iVar2 = js_resolve_module(ctx,m_00);
      if (iVar2 < 0) {
        return -1;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar3 < m->req_module_entries_count);
  }
  return 0;
}

Assistant:

static int js_resolve_module(JSContext *ctx, JSModuleDef *m)
{
    int i;
    JSModuleDef *m1;

    if (m->resolved)
        return 0;
#ifdef DUMP_MODULE_RESOLVE
    {
        char buf1[ATOM_GET_STR_BUF_SIZE];
        printf("resolving module '%s':\n", JS_AtomGetStr(ctx, buf1, sizeof(buf1), m->module_name));
    }
#endif
    m->resolved = TRUE;
    /* resolve each requested module */
    for(i = 0; i < m->req_module_entries_count; i++) {
        JSReqModuleEntry *rme = &m->req_module_entries[i];
        m1 = js_host_resolve_imported_module_atom(ctx, m->module_name,
                                                  rme->module_name);
        if (!m1)
            return -1;
        rme->module = m1;
        /* already done in js_host_resolve_imported_module() except if
           the module was loaded with JS_EvalBinary() */
        if (js_resolve_module(ctx, m1) < 0)
            return -1;
    }
    return 0;
}